

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O1

XrFormFactor GetXrFormFactor(string *formFactorStr)

{
  size_type sVar1;
  _Alloc_hider _Var2;
  char cVar3;
  char cVar4;
  ctype *pcVar5;
  invalid_argument *this;
  size_type sVar6;
  bool bVar7;
  string local_68;
  string *local_48;
  locale local_40 [8];
  char *local_38;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_48 = formFactorStr;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Hmd","");
  std::locale::locale(local_40);
  pcVar5 = std::use_facet<std::ctype<char>>(local_40);
  _Var2._M_p = local_68._M_dataplus._M_p;
  sVar1 = local_48->_M_string_length;
  if (sVar1 == local_68._M_string_length) {
    bVar7 = sVar1 == 0;
    if (!bVar7) {
      local_38 = (local_48->_M_dataplus)._M_p;
      cVar4 = *local_68._M_dataplus._M_p;
      cVar3 = (**(code **)(*(long *)pcVar5 + 0x20))(pcVar5,(int)*local_38);
      cVar4 = (**(code **)(*(long *)pcVar5 + 0x20))(pcVar5,(int)cVar4);
      if (cVar3 == cVar4) {
        sVar6 = 1;
        do {
          bVar7 = sVar1 == sVar6;
          if (bVar7) goto LAB_0010c142;
          cVar4 = _Var2._M_p[sVar6];
          cVar3 = (**(code **)(*(long *)pcVar5 + 0x20))(pcVar5,(int)local_38[sVar6]);
          cVar4 = (**(code **)(*(long *)pcVar5 + 0x20))(pcVar5,(int)cVar4);
          sVar6 = sVar6 + 1;
        } while (cVar3 == cVar4);
      }
      goto LAB_0010c140;
    }
  }
  else {
LAB_0010c140:
    bVar7 = false;
  }
LAB_0010c142:
  std::locale::~locale(local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (bVar7) {
    return XR_FORM_FACTOR_HEAD_MOUNTED_DISPLAY;
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Handheld","");
  std::locale::locale(local_40);
  pcVar5 = std::use_facet<std::ctype<char>>(local_40);
  _Var2._M_p = local_68._M_dataplus._M_p;
  sVar1 = local_48->_M_string_length;
  if (sVar1 == local_68._M_string_length) {
    bVar7 = sVar1 == 0;
    if (bVar7) goto LAB_0010c234;
    local_38 = (local_48->_M_dataplus)._M_p;
    cVar4 = *local_68._M_dataplus._M_p;
    cVar3 = (**(code **)(*(long *)pcVar5 + 0x20))(pcVar5,(int)*local_38);
    cVar4 = (**(code **)(*(long *)pcVar5 + 0x20))(pcVar5,(int)cVar4);
    if (cVar3 == cVar4) {
      sVar6 = 1;
      do {
        bVar7 = sVar1 == sVar6;
        if (bVar7) goto LAB_0010c234;
        cVar4 = _Var2._M_p[sVar6];
        cVar3 = (**(code **)(*(long *)pcVar5 + 0x20))(pcVar5,(int)local_38[sVar6]);
        cVar4 = (**(code **)(*(long *)pcVar5 + 0x20))(pcVar5,(int)cVar4);
        sVar6 = sVar6 + 1;
      } while (cVar3 == cVar4);
    }
  }
  bVar7 = false;
LAB_0010c234:
  std::locale::~locale(local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (bVar7) {
    return XR_FORM_FACTOR_HANDHELD_DISPLAY;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  Fmt_abi_cxx11_(&local_68,"Unknown form factor \'%s\'",(local_48->_M_dataplus)._M_p);
  std::invalid_argument::invalid_argument(this,(string *)&local_68);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline XrFormFactor GetXrFormFactor(const std::string& formFactorStr) {
    if (EqualsIgnoreCase(formFactorStr, "Hmd")) {
        return XR_FORM_FACTOR_HEAD_MOUNTED_DISPLAY;
    }
    if (EqualsIgnoreCase(formFactorStr, "Handheld")) {
        return XR_FORM_FACTOR_HANDHELD_DISPLAY;
    }
    throw std::invalid_argument(Fmt("Unknown form factor '%s'", formFactorStr.c_str()));
}